

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

float32 diag_norm(vector_t var,uint32 len)

{
  ulong uVar1;
  double dVar2;
  float fVar3;
  
  if (len == 0) {
    fVar3 = 0.0;
  }
  else {
    uVar1 = 0;
    fVar3 = 0.0;
    do {
      if (var[uVar1] <= 0.0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x152,"Sanity check var[i] > 0 failed: %e\n");
        exit(1);
      }
      dVar2 = log((double)var[uVar1]);
      fVar3 = (float)((double)fVar3 + dVar2);
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  return (float32)(((float)((double)len * 1.8378770664093453) + fVar3) * -0.5);
}

Assistant:

float32
diag_norm(vector_t var,
	  uint32 len)
{
    float32 log_det;
    float32 p;
    uint32 i;

    log_det = 0;

    for (i = 0; i < len; i++) {
	if (var[i] <= 0) {
	    E_FATAL("Sanity check var[i] > 0 failed: %e\n", var[i]);
	}
	log_det += log(var[i]);
    }

    p = len * log(2.0 * M_PI);

    return - 0.5 * (log_det + p);
}